

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall fmt::v10::detail::bigint::assign(bigint *this,bigint *other)

{
  size_t count;
  uint *puVar1;
  uint *puVar2;
  long lVar3;
  
  count = (other->bigits_).super_buffer<unsigned_int>.size_;
  buffer<unsigned_int>::try_resize((buffer<unsigned_int> *)this,count);
  puVar1 = (other->bigits_).super_buffer<unsigned_int>.ptr_;
  puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
  for (lVar3 = 0; count << 2 != lVar3; lVar3 = lVar3 + 4) {
    *(undefined4 *)((long)puVar2 + lVar3) = *(undefined4 *)((long)puVar1 + lVar3);
  }
  this->exp_ = other->exp_;
  return;
}

Assistant:

FMT_CONSTEXPR20 void assign(const bigint& other) {
    auto size = other.bigits_.size();
    bigits_.resize(size);
    auto data = other.bigits_.data();
    copy_str<bigit>(data, data + size, bigits_.data());
    exp_ = other.exp_;
  }